

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O0

void __thiscall cppcms::http::impl::file_buffer::sync(file_buffer *this)

{
  int iVar1;
  file_buffer *in_stack_00000008;
  
  if (((this->in_memory_ & 1U) == 0) && (iVar1 = write_buffer(in_stack_00000008), iVar1 == 0)) {
    fflush((FILE *)this->f_);
  }
  return;
}

Assistant:

int sync()
	{
		if(in_memory_)
			return 0;
		if(write_buffer()!=0)
			return -1;
		if(fflush(f_)!=0)
			return -1;
		return 0;
	}